

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata_unittest.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_347e::ProfileDataTest_CollectOne_Test::ProfileDataTest_CollectOne_Test
          (ProfileDataTest_CollectOne_Test *this)

{
  ProfileDataTest_CollectOne_Test *this_local;
  
  ProfileDataTest::ProfileDataTest(&this->super_ProfileDataTest);
  (this->super_ProfileDataTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ProfileDataTest_CollectOne_Test_00197970;
  return;
}

Assistant:

TEST_F(ProfileDataTest, CollectOne) {
  const int frequency = 2;
  ProfileDataSlot slots[] = {
    0, 3, 0, 1000000 / frequency, 0,    // binary header
    1, 5, 100, 101, 102, 103, 104,      // our sample
    0, 1, 0                             // binary trailer
  };

  ExpectStopped();
  ProfileData::Options options;
  options.set_frequency(frequency);
  EXPECT_TRUE(collector_.Start(checker_.filename().c_str(), options));
  ExpectRunningSamples(0);

  const void *trace[] = { V(100), V(101), V(102), V(103), V(104) };
  collector_.Add(arraysize(trace), trace);
  ExpectRunningSamples(1);

  collector_.Stop();
  ExpectStopped();
  EXPECT_EQ(kNoError, checker_.ValidateProfile());
  EXPECT_EQ(kNoError, checker_.Check(slots, arraysize(slots)));
}